

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_parentlessUsingRemoveAllVariables_Test::Variable_parentlessUsingRemoveAllVariables_Test
          (Variable_parentlessUsingRemoveAllVariables_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00139320;
  return;
}

Assistant:

TEST(Variable, parentlessUsingRemoveAllVariables)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");
    v2->setName("variable2");

    v1->setUnits("dimensionless");
    v2->setUnits("dimensionless");

    comp1->addVariable(v1);
    comp1->addVariable(v2);
    m->addComponent(comp1);

    EXPECT_TRUE(v1->hasParent());
    EXPECT_TRUE(v2->hasParent());

    // Make a variable without a parent component.
    comp1->removeAllVariables();

    EXPECT_EQ(size_t(0), comp1->variableCount());
    EXPECT_FALSE(v1->hasParent());
    EXPECT_FALSE(v2->hasParent());
    EXPECT_EQ(nullptr, v1->parent());
    EXPECT_EQ(nullptr, v2->parent());
}